

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiTiledPartThreading.cpp
# Opt level: O2

void testMultiTiledPartThreading(string *tempDir)

{
  uint *puVar1;
  ulong uVar2;
  Header *pHVar3;
  pointer pTVar4;
  _Alloc_hider _Var5;
  char cVar6;
  bool bVar7;
  __type _Var8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ostream *poVar17;
  long lVar18;
  char *pcVar19;
  ThreadPool *pTVar20;
  WritingTask *pWVar21;
  Box<Imath_3_2::Vec2<int>_> *pBVar22;
  Box<Imath_3_2::Vec2<int>_> *pBVar23;
  float *pfVar24;
  float *pfVar25;
  ChannelList *this;
  ChannelList *pCVar26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar28;
  ReadingTask *pRVar29;
  int iVar30;
  undefined1 *puVar31;
  int iVar32;
  uint uVar33;
  int i;
  string *psVar34;
  ulong uVar35;
  TiledInputPart *pTVar36;
  int iVar37;
  ulong uVar38;
  int iVar39;
  long lVar40;
  half *phVar41;
  ulong uVar42;
  ulong uVar43;
  int *piVar44;
  ulong uVar45;
  stringstream *psVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  float fVar50;
  ulong local_3e0;
  long local_3b0;
  half local_39a;
  TiledInputPart *local_398;
  long local_390;
  MultiPartOutputFile file;
  Header header;
  Array2D<Imath_3_2::half> halfData [2];
  vector<Imf_3_4::TiledOutputPart,_std::allocator<Imf_3_4::TiledOutputPart>_> parts;
  Array2D<unsigned_int> uintData [2];
  Array2D<float> floatData [2];
  undefined1 *local_238;
  undefined8 local_230;
  undefined1 local_228 [16];
  string fn;
  string typeNames [2];
  stringstream ss;
  undefined4 local_1b0 [2];
  long local_1a8 [47];
  
  poVar17 = std::operator<<((ostream *)&std::cout,
                            "Testing the two threads reading/writing on two-tiled-part file");
  std::endl<char,std::char_traits<char>>(poVar17);
  IlmThread_3_4::ThreadPool::globalThreadPool();
  IlmThread_3_4::ThreadPool::numThreads();
  iVar9 = IlmThread_3_4::ThreadPool::globalThreadPool();
  IlmThread_3_4::ThreadPool::setNumThreads(iVar9);
  iVar9 = 0;
  do {
    if (iVar9 == 3) {
      iVar9 = IlmThread_3_4::ThreadPool::globalThreadPool();
      IlmThread_3_4::ThreadPool::setNumThreads(iVar9);
      poVar17 = std::operator<<((ostream *)&std::cout,"ok\n");
      std::endl<char,std::char_traits<char>>(poVar17);
      return;
    }
    for (iVar30 = 0; iVar30 != 3; iVar30 = iVar30 + 1) {
      for (uVar33 = 0; uVar33 != 3; uVar33 = uVar33 + 1) {
        uVar16 = 1;
        while( true ) {
          if (0xc4 < uVar16) break;
          (anonymous_namespace)::pixelTypes = iVar9;
          DAT_001d3e24 = iVar30;
          (anonymous_namespace)::levelMode = uVar33;
          (anonymous_namespace)::tileSize = uVar16;
          std::operator+(&fn,tempDir,"imf_test_multi_tiled_part_threading.exr");
          lVar18 = 0x10;
          do {
            puVar31 = (undefined1 *)((long)&typeNames[0]._M_dataplus._M_p + lVar18);
            *(undefined1 **)((long)typeNames + lVar18 + -0x10) = puVar31;
            *(undefined8 *)((long)typeNames + lVar18 + -8) = 0;
            *puVar31 = 0;
            lVar18 = lVar18 + 0x20;
          } while (lVar18 != 0x50);
          local_238 = local_228;
          local_230 = 0;
          local_228[0] = 0;
          psVar34 = typeNames;
          for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 4) {
            if (*(uint *)((long)&(anonymous_namespace)::pixelTypes + lVar18) < 3) {
              std::__cxx11::string::assign((char *)psVar34);
            }
            if ((anonymous_namespace)::levelMode < 3) {
              std::__cxx11::string::assign((char *)&local_238);
            }
            psVar34 = psVar34 + 1;
          }
          poVar17 = std::operator<<((ostream *)&std::cout,"part 1: type ");
          poVar17 = std::operator<<(poVar17,(string *)typeNames);
          poVar17 = std::operator<<(poVar17," tiled part, ");
          poVar17 = std::operator<<(poVar17,"part 2: type ");
          poVar17 = std::operator<<(poVar17,(string *)(typeNames + 1));
          poVar17 = std::operator<<(poVar17," tiled part, ");
          poVar17 = std::operator<<(poVar17,"level mode ");
          poVar17 = std::operator<<(poVar17,(string *)&local_238);
          poVar17 = std::operator<<(poVar17," tile size ");
          poVar17 = (ostream *)std::ostream::operator<<(poVar17,(anonymous_namespace)::tileSize);
          poVar17 = std::operator<<(poVar17,"x");
          poVar17 = (ostream *)std::ostream::operator<<(poVar17,(anonymous_namespace)::tileSize);
          std::endl<char,std::char_traits<char>>(poVar17);
          std::ostream::flush();
          std::operator<<((ostream *)&std::cout,"Generating headers ");
          std::ostream::flush();
          std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::clear
                    ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
                     &(anonymous_namespace)::headers);
          piVar44 = &(anonymous_namespace)::pixelTypes;
          for (lVar18 = 0; lVar18 != 2; lVar18 = lVar18 + 1) {
            _ss = 0;
            Imf_3_4::Header::Header
                      (&header,0xc5,0x107,1.0,(Vec2 *)&ss,1.0,INCREASING_Y,ZIP_COMPRESSION);
            iVar10 = *piVar44;
            std::__cxx11::stringstream::stringstream((stringstream *)&ss);
            std::ostream::operator<<(local_1a8,(int)lVar18);
            std::__cxx11::stringbuf::str();
            Imf_3_4::Header::setName((string *)&header);
            std::__cxx11::string::~string((string *)halfData);
            if (iVar10 == 0) {
              pcVar19 = (char *)Imf_3_4::Header::channels();
              Imf_3_4::Channel::Channel((Channel *)halfData,UINT,1,1,false);
              Imf_3_4::ChannelList::insert(pcVar19,(Channel *)"UINT");
            }
            else if (iVar10 == 1) {
              pcVar19 = (char *)Imf_3_4::Header::channels();
              Imf_3_4::Channel::Channel((Channel *)halfData,FLOAT,1,1,false);
              Imf_3_4::ChannelList::insert(pcVar19,(Channel *)"FLOAT");
            }
            else if (iVar10 == 2) {
              pcVar19 = (char *)Imf_3_4::Header::channels();
              Imf_3_4::Channel::Channel((Channel *)halfData,HALF,1,1,false);
              Imf_3_4::ChannelList::insert(pcVar19,(Channel *)"HALF");
            }
            Imf_3_4::Header::setType((string *)&header);
            uVar12 = (anonymous_namespace)::levelMode;
            if (2 < (anonymous_namespace)::levelMode) {
              uVar12 = 3;
            }
            halfData[0]._sizeX =
                 CONCAT44((anonymous_namespace)::tileSize,(anonymous_namespace)::tileSize);
            halfData[0]._sizeY = (long)uVar12;
            Imf_3_4::Header::setTileDescription((TileDescription *)&header);
            std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
                      ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
                       &(anonymous_namespace)::headers,(value_type *)&header);
            std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
            Imf_3_4::Header::~Header(&header);
            piVar44 = piVar44 + 1;
          }
          remove(fn._M_dataplus._M_p);
          _Var5 = fn._M_dataplus;
          lVar18 = DAT_001d3e10;
          pHVar3 = (anonymous_namespace)::headers;
          iVar10 = Imf_3_4::globalThreadCount();
          Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
                    (&file,_Var5._M_p,pHVar3,(int)((lVar18 - (long)pHVar3) / 0x38),false,iVar10);
          parts.
          super__Vector_base<Imf_3_4::TiledOutputPart,_std::allocator<Imf_3_4::TiledOutputPart>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          parts.
          super__Vector_base<Imf_3_4::TiledOutputPart,_std::allocator<Imf_3_4::TiledOutputPart>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          parts.
          super__Vector_base<Imf_3_4::TiledOutputPart,_std::allocator<Imf_3_4::TiledOutputPart>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          halfData[1]._sizeY = 0;
          halfData[1]._data = (half *)0x0;
          halfData[0]._data = (half *)0x0;
          halfData[1]._sizeX = 0;
          halfData[0]._sizeX = 0;
          halfData[0]._sizeY = 0;
          floatData[1]._sizeY = 0;
          floatData[1]._data = (float *)0x0;
          floatData[0]._data = (float *)0x0;
          floatData[1]._sizeX = 0;
          floatData[0]._sizeX = 0;
          floatData[0]._sizeY = 0;
          uintData[1]._sizeY = 0;
          uintData[1]._data = (uint *)0x0;
          uintData[0]._data = (uint *)0x0;
          uintData[1]._sizeX = 0;
          uintData[0]._sizeX = 0;
          uintData[0]._sizeY = 0;
          for (iVar10 = 0; iVar10 != 2; iVar10 = iVar10 + 1) {
            Imf_3_4::TiledOutputPart::TiledOutputPart((TiledOutputPart *)&ss,&file,iVar10);
            std::vector<Imf_3_4::TiledOutputPart,_std::allocator<Imf_3_4::TiledOutputPart>_>::
            push_back(&parts,(TiledOutputPart *)&ss);
          }
          std::operator<<((ostream *)&std::cout,"Writing files ");
          std::ostream::flush();
          pTVar4 = parts.
                   super__Vector_base<Imf_3_4::TiledOutputPart,_std::allocator<Imf_3_4::TiledOutputPart>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar10 = Imf_3_4::TiledOutputPart::numXLevels();
          iVar11 = Imf_3_4::TiledOutputPart::numYLevels();
          iVar39 = 0;
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          for (; iVar39 != iVar10; iVar39 = iVar39 + 1) {
            for (iVar32 = 0; iVar32 != iVar11; iVar32 = iVar32 + 1) {
              iVar15 = (int)pTVar4;
              cVar6 = Imf_3_4::TiledOutputPart::isValidLevel(iVar15,iVar39);
              if (cVar6 != '\0') {
                uVar12 = Imf_3_4::TiledOutputPart::levelWidth(iVar15);
                uVar13 = Imf_3_4::TiledOutputPart::levelHeight(iVar15);
                lVar18 = 0;
                do {
                  *(undefined4 *)((long)local_1b0 + lVar18) = 0;
                  *(undefined8 *)((long)local_1a8 + lVar18) = 0;
                  *(long *)((long)local_1a8 + lVar18 + 8) = (long)local_1b0 + lVar18;
                  *(long *)((long)local_1a8 + lVar18 + 0x10) = (long)local_1b0 + lVar18;
                  *(undefined8 *)((long)local_1a8 + lVar18 + 0x18) = 0;
                  lVar18 = lVar18 + 0x30;
                } while (lVar18 != 0x60);
                local_390 = (long)(int)uVar13;
                local_398 = (TiledInputPart *)(long)(int)uVar12;
                uVar45 = 0;
                if (0 < (int)uVar12) {
                  uVar45 = (ulong)uVar12;
                }
                uVar38 = 0;
                if (0 < (int)uVar13) {
                  uVar38 = (ulong)uVar13;
                }
                uVar2 = (long)local_398 * 2;
                uVar35 = (long)local_398 * 4;
                for (lVar18 = 0; lVar18 != 2; lVar18 = lVar18 + 1) {
                  iVar14 = (&(anonymous_namespace)::pixelTypes)[lVar18];
                  if (iVar14 == 2) {
                    Imf_3_4::Array2D<Imath_3_2::half>::resizeErase
                              (halfData + lVar18,local_390,(long)local_398);
                    iVar14 = 0;
                    lVar40 = 0;
                    for (uVar42 = 0; uVar42 != uVar38; uVar42 = uVar42 + 1) {
                      iVar37 = iVar14;
                      for (uVar43 = 0; (uint)((int)uVar45 * 2) != uVar43; uVar43 = uVar43 + 2) {
                        Imath_3_2::half::operator=
                                  ((half *)((long)&(halfData[lVar18]._data)->_h +
                                           uVar43 + halfData[lVar18]._sizeY * lVar40),
                                   (float)(iVar37 % 0x801));
                        iVar37 = iVar37 + 1;
                      }
                      lVar40 = lVar40 + 2;
                      iVar14 = iVar14 + uVar12;
                    }
LAB_0016ff8a:
                    iVar14 = (&(anonymous_namespace)::pixelTypes)[lVar18];
                  }
                  else {
                    if (iVar14 == 1) {
                      Imf_3_4::Array2D<float>::resizeErase
                                (floatData + lVar18,local_390,(long)local_398);
                      iVar14 = 0;
                      lVar40 = 0;
                      for (uVar42 = 0; uVar42 != uVar38; uVar42 = uVar42 + 1) {
                        lVar48 = floatData[lVar18]._sizeY;
                        pfVar24 = floatData[lVar18]._data;
                        for (uVar43 = 0; uVar45 != uVar43; uVar43 = uVar43 + 1) {
                          *(float *)((long)pfVar24 + uVar43 * 4 + lVar48 * lVar40) =
                               (float)((iVar14 + (int)uVar43) % 0x801);
                        }
                        lVar40 = lVar40 + 4;
                        iVar14 = iVar14 + uVar12;
                      }
                      goto LAB_0016ff8a;
                    }
                    if (iVar14 == 0) {
                      Imf_3_4::Array2D<unsigned_int>::resizeErase
                                (uintData + lVar18,local_390,(long)local_398);
                      iVar14 = 0;
                      lVar40 = 0;
                      for (uVar42 = 0; uVar42 != uVar38; uVar42 = uVar42 + 1) {
                        lVar48 = uintData[lVar18]._sizeY;
                        puVar1 = uintData[lVar18]._data;
                        for (uVar43 = 0; uVar45 != uVar43; uVar43 = uVar43 + 1) {
                          *(int *)((long)puVar1 + uVar43 * 4 + lVar48 * lVar40) =
                               (iVar14 + (int)uVar43) % 0x801;
                        }
                        lVar40 = lVar40 + 4;
                        iVar14 = iVar14 + uVar12;
                      }
                      goto LAB_0016ff8a;
                    }
                  }
                  psVar46 = &ss + lVar18 * 0x30;
                  if (iVar14 == 2) {
                    Imf_3_4::Slice::Slice
                              ((Slice *)&header,HALF,(char *)halfData[lVar18]._data,2,uVar2,1,1,0.0,
                               false,false);
                    Imf_3_4::FrameBuffer::insert((char *)psVar46,(Slice *)"HALF");
                  }
                  else if (iVar14 == 1) {
                    Imf_3_4::Slice::Slice
                              ((Slice *)&header,FLOAT,(char *)floatData[lVar18]._data,4,uVar35,1,1,
                               0.0,false,false);
                    Imf_3_4::FrameBuffer::insert((char *)psVar46,(Slice *)"FLOAT");
                  }
                  else if (iVar14 == 0) {
                    Imf_3_4::Slice::Slice
                              ((Slice *)&header,UINT,(char *)uintData[lVar18]._data,4,uVar35,1,1,0.0
                               ,false,false);
                    Imf_3_4::FrameBuffer::insert((char *)psVar46,(Slice *)"UINT");
                  }
                  Imf_3_4::TiledOutputPart::setFrameBuffer
                            ((FrameBuffer *)
                             (parts.
                              super__Vector_base<Imf_3_4::TiledOutputPart,_std::allocator<Imf_3_4::TiledOutputPart>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar18 * 8));
                }
                IlmThread_3_4::TaskGroup::TaskGroup((TaskGroup *)&header);
                pTVar20 = (ThreadPool *)operator_new(0x10);
                IlmThread_3_4::ThreadPool::ThreadPool(pTVar20,2);
                iVar14 = Imf_3_4::TiledOutputPart::numXTiles(iVar15);
                iVar15 = Imf_3_4::TiledOutputPart::numYTiles(iVar15);
                iVar37 = 0;
                if (iVar15 < 1) {
                  iVar15 = iVar37;
                }
                for (; iVar15 != iVar37; iVar37 = iVar37 + 1) {
                  pWVar21 = (WritingTask *)operator_new(0x28);
                  anon_unknown.dwarf_206f3e::WritingTask::WritingTask
                            (pWVar21,(TaskGroup *)&header,
                             parts.
                             super__Vector_base<Imf_3_4::TiledOutputPart,_std::allocator<Imf_3_4::TiledOutputPart>_>
                             ._M_impl.super__Vector_impl_data._M_start,iVar39,iVar32,iVar37,iVar14);
                  IlmThread_3_4::ThreadPool::addTask((Task *)pTVar20);
                  pWVar21 = (WritingTask *)operator_new(0x28);
                  anon_unknown.dwarf_206f3e::WritingTask::WritingTask
                            (pWVar21,(TaskGroup *)&header,
                             parts.
                             super__Vector_base<Imf_3_4::TiledOutputPart,_std::allocator<Imf_3_4::TiledOutputPart>_>
                             ._M_impl.super__Vector_impl_data._M_start + 8,iVar39,iVar32,iVar37,
                             iVar14);
                  IlmThread_3_4::ThreadPool::addTask((Task *)pTVar20);
                }
                (**(code **)(*(long *)pTVar20 + 8))(pTVar20);
                IlmThread_3_4::TaskGroup::~TaskGroup((TaskGroup *)&header);
                lVar18 = 0x30;
                do {
                  std::
                  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                               *)(&ss + lVar18));
                  lVar18 = lVar18 + -0x30;
                } while (lVar18 != -0x30);
              }
            }
          }
          lVar18 = 0x18;
          do {
            Imf_3_4::Array2D<unsigned_int>::~Array2D
                      ((Array2D<unsigned_int> *)((long)&uintData[0]._sizeX + lVar18));
            lVar18 = lVar18 + -0x18;
          } while (lVar18 != -0x18);
          lVar18 = 0x18;
          do {
            Imf_3_4::Array2D<float>::~Array2D
                      ((Array2D<float> *)((long)&floatData[0]._sizeX + lVar18));
            lVar18 = lVar18 + -0x18;
          } while (lVar18 != -0x18);
          lVar18 = 0x18;
          do {
            Imf_3_4::Array2D<Imath_3_2::half>::~Array2D
                      ((Array2D<Imath_3_2::half> *)((long)&halfData[0]._sizeX + lVar18));
            lVar18 = lVar18 + -0x18;
          } while (lVar18 != -0x18);
          std::_Vector_base<Imf_3_4::TiledOutputPart,_std::allocator<Imf_3_4::TiledOutputPart>_>::
          ~_Vector_base(&parts.
                         super__Vector_base<Imf_3_4::TiledOutputPart,_std::allocator<Imf_3_4::TiledOutputPart>_>
                       );
          Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(&file);
          std::operator<<((ostream *)&std::cout,"Checking headers ");
          std::ostream::flush();
          _Var5 = fn._M_dataplus;
          iVar10 = Imf_3_4::globalThreadCount();
          Imf_3_4::MultiPartInputFile::MultiPartInputFile
                    ((MultiPartInputFile *)&parts,_Var5._M_p,iVar10,true);
          iVar10 = Imf_3_4::MultiPartInputFile::parts();
          if (iVar10 != 2) {
            __assert_fail("file.parts () == 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                          ,0x176,"void (anonymous namespace)::readFiles(const std::string &)");
          }
          lVar18 = 0;
          while (lVar18 != 2) {
            Imf_3_4::MultiPartInputFile::header((int)&parts);
            pBVar22 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::displayWindow();
            pBVar23 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::displayWindow();
            bVar7 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar22,pBVar23);
            if (!bVar7) {
              __assert_fail("header.displayWindow () == headers[i].displayWindow ()",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                            ,0x17a,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            pBVar22 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
            pBVar23 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
            bVar7 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar22,pBVar23);
            if (!bVar7) {
              __assert_fail("header.dataWindow () == headers[i].dataWindow ()",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                            ,0x17b,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            pfVar24 = (float *)Imf_3_4::Header::pixelAspectRatio();
            fVar50 = *pfVar24;
            pfVar24 = (float *)Imf_3_4::Header::pixelAspectRatio();
            if ((fVar50 != *pfVar24) || (NAN(fVar50) || NAN(*pfVar24))) {
              __assert_fail("header.pixelAspectRatio () == headers[i].pixelAspectRatio ()",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                            ,0x17c,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            pfVar24 = (float *)Imf_3_4::Header::screenWindowCenter();
            pfVar25 = (float *)Imf_3_4::Header::screenWindowCenter();
            if ((((*pfVar24 != *pfVar25) || (NAN(*pfVar24) || NAN(*pfVar25))) ||
                (pfVar24[1] != pfVar25[1])) || (NAN(pfVar24[1]) || NAN(pfVar25[1]))) {
              __assert_fail("header.screenWindowCenter () == headers[i].screenWindowCenter ()",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                            ,0x17e,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            pfVar24 = (float *)Imf_3_4::Header::screenWindowWidth();
            fVar50 = *pfVar24;
            pfVar24 = (float *)Imf_3_4::Header::screenWindowWidth();
            if ((fVar50 != *pfVar24) || (NAN(fVar50) || NAN(*pfVar24))) {
              __assert_fail("header.screenWindowWidth () == headers[i].screenWindowWidth ()",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                            ,0x17f,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            piVar44 = (int *)Imf_3_4::Header::lineOrder();
            iVar10 = *piVar44;
            piVar44 = (int *)Imf_3_4::Header::lineOrder();
            if (iVar10 != *piVar44) {
              __assert_fail("header.lineOrder () == headers[i].lineOrder ()",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                            ,0x180,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            piVar44 = (int *)Imf_3_4::Header::compression();
            iVar10 = *piVar44;
            piVar44 = (int *)Imf_3_4::Header::compression();
            if (iVar10 != *piVar44) {
              __assert_fail("header.compression () == headers[i].compression ()",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                            ,0x181,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            this = (ChannelList *)Imf_3_4::Header::channels();
            pCVar26 = (ChannelList *)Imf_3_4::Header::channels();
            cVar6 = Imf_3_4::ChannelList::operator==(this,pCVar26);
            if (cVar6 == '\0') {
              __assert_fail("header.channels () == headers[i].channels ()",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                            ,0x182,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      Imf_3_4::Header::name_abi_cxx11_();
            pbVar28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      Imf_3_4::Header::name_abi_cxx11_();
            _Var8 = std::operator==(pbVar27,pbVar28);
            if (!_Var8) {
              __assert_fail("header.name () == headers[i].name ()",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                            ,0x183,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      Imf_3_4::Header::type_abi_cxx11_();
            pbVar28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      Imf_3_4::Header::type_abi_cxx11_();
            _Var8 = std::operator==(pbVar27,pbVar28);
            lVar18 = lVar18 + 1;
            if (!_Var8) {
              __assert_fail("header.type () == headers[i].type ()",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                            ,0x184,"void (anonymous namespace)::readFiles(const std::string &)");
            }
          }
          halfData[1]._sizeY = 0;
          halfData[1]._data = (half *)0x0;
          halfData[0]._data = (half *)0x0;
          halfData[1]._sizeX = 0;
          halfData[0]._sizeX = 0;
          halfData[0]._sizeY = 0;
          floatData[1]._sizeY = 0;
          floatData[1]._data = (float *)0x0;
          floatData[0]._data = (float *)0x0;
          floatData[1]._sizeX = 0;
          floatData[0]._sizeX = 0;
          floatData[0]._sizeY = 0;
          uintData[1]._sizeY = 0;
          uintData[1]._data = (uint *)0x0;
          uintData[0]._data = (uint *)0x0;
          uintData[1]._sizeX = 0;
          uintData[0]._sizeX = 0;
          uintData[0]._sizeY = 0;
          _file = (TiledInputPart *)0x0;
          for (iVar10 = 0; iVar10 != 2; iVar10 = iVar10 + 1) {
            Imf_3_4::TiledInputPart::TiledInputPart
                      ((TiledInputPart *)&ss,(MultiPartInputFile *)&parts,iVar10);
            std::vector<Imf_3_4::TiledInputPart,_std::allocator<Imf_3_4::TiledInputPart>_>::
            push_back((vector<Imf_3_4::TiledInputPart,_std::allocator<Imf_3_4::TiledInputPart>_> *)
                      &file,(TiledInputPart *)&ss);
          }
          std::operator<<((ostream *)&std::cout,"Reading and comparing files ");
          std::ostream::flush();
          pTVar36 = _file;
          iVar10 = Imf_3_4::TiledInputPart::numXLevels();
          iVar11 = Imf_3_4::TiledInputPart::numYLevels();
          iVar39 = 0;
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          local_390 = CONCAT44(local_390._4_4_,iVar11);
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          local_398 = pTVar36;
          for (; iVar39 != iVar10; iVar39 = iVar39 + 1) {
            iVar11 = 0;
            while( true ) {
              psVar46 = &ss;
              if (iVar11 == (int)local_390) break;
              iVar32 = (int)pTVar36;
              cVar6 = Imf_3_4::TiledInputPart::isValidLevel(iVar32,iVar39);
              if (cVar6 != '\0') {
                iVar15 = Imf_3_4::TiledInputPart::levelWidth(iVar32);
                uVar12 = Imf_3_4::TiledInputPart::levelHeight(iVar32);
                lVar18 = 0;
                do {
                  *(undefined4 *)((long)local_1b0 + lVar18) = 0;
                  *(undefined8 *)((long)local_1a8 + lVar18) = 0;
                  *(long *)((long)local_1a8 + lVar18 + 8) = (long)local_1b0 + lVar18;
                  *(long *)((long)local_1a8 + lVar18 + 0x10) = (long)local_1b0 + lVar18;
                  *(undefined8 *)((long)local_1a8 + lVar18 + 0x18) = 0;
                  lVar18 = lVar18 + 0x30;
                } while (lVar18 != 0x60);
                lVar48 = (long)(int)uVar12;
                lVar40 = (long)iVar15;
                piVar44 = &(anonymous_namespace)::pixelTypes;
                lVar49 = 0;
                for (lVar18 = 0; lVar18 != 0x30; lVar18 = lVar18 + 0x18) {
                  iVar32 = *piVar44;
                  if (iVar32 == 2) {
                    Imf_3_4::Array2D<Imath_3_2::half>::resizeErase
                              ((Array2D<Imath_3_2::half> *)((long)&uintData[0]._sizeX + lVar18),
                               lVar48,lVar40);
                    Imf_3_4::Slice::Slice
                              ((Slice *)&header,HALF,*(char **)((long)&uintData[0]._data + lVar18),2
                               ,lVar40 * 2,1,1,0.0,false,false);
                    Imf_3_4::FrameBuffer::insert((char *)psVar46,(Slice *)"HALF");
                  }
                  else if (iVar32 == 1) {
                    Imf_3_4::Array2D<float>::resizeErase
                              ((Array2D<float> *)((long)&floatData[0]._sizeX + lVar18),lVar48,lVar40
                              );
                    Imf_3_4::Slice::Slice
                              ((Slice *)&header,FLOAT,*(char **)((long)&floatData[0]._data + lVar18)
                               ,4,lVar40 * 4,1,1,0.0,false,false);
                    Imf_3_4::FrameBuffer::insert((char *)psVar46,(Slice *)"FLOAT");
                  }
                  else if (iVar32 == 0) {
                    Imf_3_4::Array2D<unsigned_int>::resizeErase
                              ((Array2D<unsigned_int> *)((long)&halfData[0]._sizeX + lVar18),lVar48,
                               lVar40);
                    Imf_3_4::Slice::Slice
                              ((Slice *)&header,UINT,*(char **)((long)&halfData[0]._data + lVar18),4
                               ,lVar40 * 4,1,1,0.0,false,false);
                    Imf_3_4::FrameBuffer::insert((char *)psVar46,(Slice *)"UINT");
                  }
                  Imf_3_4::TiledInputPart::setFrameBuffer((FrameBuffer *)(_file + lVar49));
                  lVar49 = lVar49 + 8;
                  piVar44 = piVar44 + 1;
                  psVar46 = psVar46 + 0x30;
                }
                IlmThread_3_4::TaskGroup::TaskGroup((TaskGroup *)&header);
                pTVar20 = (ThreadPool *)operator_new(0x10);
                IlmThread_3_4::ThreadPool::ThreadPool(pTVar20,2);
                iVar32 = (int)local_398;
                iVar14 = Imf_3_4::TiledInputPart::numXTiles(iVar32);
                iVar32 = Imf_3_4::TiledInputPart::numYTiles(iVar32);
                iVar37 = 0;
                if (iVar32 < 1) {
                  iVar32 = iVar37;
                }
                for (; iVar32 != iVar37; iVar37 = iVar37 + 1) {
                  pRVar29 = (ReadingTask *)operator_new(0x28);
                  anon_unknown.dwarf_206f3e::ReadingTask::ReadingTask
                            (pRVar29,(TaskGroup *)&header,_file,iVar39,iVar11,iVar37,iVar14);
                  IlmThread_3_4::ThreadPool::addTask((Task *)pTVar20);
                  pRVar29 = (ReadingTask *)operator_new(0x28);
                  anon_unknown.dwarf_206f3e::ReadingTask::ReadingTask
                            (pRVar29,(TaskGroup *)&header,_file + 8,iVar39,iVar11,iVar37,iVar14);
                  IlmThread_3_4::ThreadPool::addTask((Task *)pTVar20);
                }
                (**(code **)(*(long *)pTVar20 + 8))();
                iVar32 = iVar15 + -1;
                if (iVar15 + -1 < 0) {
                  iVar32 = -1;
                }
                lVar18 = (long)iVar32 + 1;
                uVar45 = 0;
                if (0 < (int)uVar12) {
                  uVar45 = (ulong)uVar12;
                }
                lVar40 = (long)(int)(uVar12 - 1);
                for (lVar48 = 0; lVar48 != 2; lVar48 = lVar48 + 1) {
                  iVar32 = (&(anonymous_namespace)::pixelTypes)[lVar48];
                  if (iVar32 == 2) {
                    iVar32 = 0;
                    local_3b0 = 0;
                    for (uVar38 = 0; local_3e0 = uVar45, uVar38 != uVar45; uVar38 = uVar38 + 1) {
                      for (lVar49 = 0; lVar18 != lVar49; lVar49 = lVar49 + 1) {
                        fVar50 = *(float *)(_imath_half_to_float_table +
                                           (ulong)*(ushort *)
                                                   ((long)uintData[lVar48]._data +
                                                   lVar49 * 2 + uintData[lVar48]._sizeY * local_3b0)
                                           * 4);
                        iVar14 = ((int)lVar49 + iVar32) % 0x801;
                        Imath_3_2::half::half(&local_39a,(float)iVar14);
                        pfVar24 = (float *)(_imath_half_to_float_table + (ulong)local_39a._h * 4);
                        if ((fVar50 != *pfVar24) || (NAN(fVar50) || NAN(*pfVar24))) {
                          poVar17 = std::operator<<((ostream *)&std::cout,"value at ");
                          poVar17 = (ostream *)std::ostream::operator<<(poVar17,(int)lVar49);
                          poVar17 = std::operator<<(poVar17,", ");
                          poVar17 = (ostream *)std::ostream::operator<<(poVar17,(int)uVar38);
                          poVar17 = std::operator<<(poVar17,": ");
                          poVar17 = (ostream *)
                                    operator<<(poVar17,(half)*(uint16_t *)
                                                              ((long)uintData[lVar48]._data +
                                                              lVar49 * 2 +
                                                              local_3b0 * uintData[lVar48]._sizeY));
                          poVar17 = std::operator<<(poVar17,", should be ");
                          poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar14);
                          std::endl<char,std::char_traits<char>>(poVar17);
                          std::ostream::flush();
                          local_3e0 = uVar38;
                          goto LAB_00170bda;
                        }
                      }
                      local_3b0 = local_3b0 + 2;
                      iVar32 = iVar32 + iVar15;
                    }
LAB_00170bda:
                    if ((long)local_3e0 <= lVar40) {
                      __assert_fail("checkPixels<half> (hData[i], w, h)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                                    ,0x1cd,
                                    "void (anonymous namespace)::readFiles(const std::string &)");
                    }
                  }
                  else if (iVar32 == 1) {
                    pfVar24 = floatData[lVar48]._data;
                    iVar32 = 0;
                    lVar49 = 0;
                    for (uVar38 = 0; uVar35 = uVar45, uVar38 != uVar45; uVar38 = uVar38 + 1) {
                      for (lVar47 = 0; lVar18 != lVar47; lVar47 = lVar47 + 1) {
                        iVar14 = (iVar32 + (int)lVar47) % 0x801;
                        fVar50 = (float)iVar14;
                        if ((pfVar24[lVar47] != fVar50) || (NAN(pfVar24[lVar47]) || NAN(fVar50))) {
                          poVar17 = std::operator<<((ostream *)&std::cout,"value at ");
                          poVar17 = (ostream *)std::ostream::operator<<(poVar17,(int)lVar47);
                          poVar17 = std::operator<<(poVar17,", ");
                          poVar17 = (ostream *)std::ostream::operator<<(poVar17,(int)uVar38);
                          poVar17 = std::operator<<(poVar17,": ");
                          poVar17 = (ostream *)
                                    std::ostream::operator<<
                                              (poVar17,*(float *)((long)floatData[lVar48]._data +
                                                                 lVar47 * 4 +
                                                                 lVar49 * floatData[lVar48]._sizeY))
                          ;
                          poVar17 = std::operator<<(poVar17,", should be ");
                          poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar14);
                          std::endl<char,std::char_traits<char>>(poVar17);
                          std::ostream::flush();
                          uVar35 = uVar38;
                          goto LAB_00170b34;
                        }
                      }
                      lVar49 = lVar49 + 4;
                      iVar32 = iVar32 + iVar15;
                      pfVar24 = pfVar24 + floatData[lVar48]._sizeY;
                    }
LAB_00170b34:
                    if ((long)uVar35 <= lVar40) {
                      __assert_fail("checkPixels<float> (fData[i], w, h)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                                    ,0x1cc,
                                    "void (anonymous namespace)::readFiles(const std::string &)");
                    }
                  }
                  else if (iVar32 == 0) {
                    phVar41 = halfData[lVar48]._data;
                    iVar32 = 0;
                    for (uVar38 = 0; uVar35 = uVar45, uVar38 != uVar45; uVar38 = uVar38 + 1) {
                      for (lVar49 = 0; lVar18 != lVar49; lVar49 = lVar49 + 1) {
                        iVar14 = (iVar32 + (int)lVar49) % 0x801;
                        if (*(int *)(phVar41 + lVar49 * 2) != iVar14) {
                          poVar17 = std::operator<<((ostream *)&std::cout,"value at ");
                          poVar17 = (ostream *)std::ostream::operator<<(poVar17,(int)lVar49);
                          poVar17 = std::operator<<(poVar17,", ");
                          poVar17 = (ostream *)std::ostream::operator<<(poVar17,(int)uVar38);
                          poVar17 = std::operator<<(poVar17,": ");
                          poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
                          poVar17 = std::operator<<(poVar17,", should be ");
                          poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar14);
                          std::endl<char,std::char_traits<char>>(poVar17);
                          std::ostream::flush();
                          uVar35 = uVar38;
                          goto LAB_00170c7d;
                        }
                      }
                      iVar32 = iVar32 + iVar15;
                      phVar41 = phVar41 + halfData[lVar48]._sizeY * 2;
                    }
LAB_00170c7d:
                    if ((long)uVar35 <= lVar40) {
                      __assert_fail("checkPixels<unsigned int> (uData[i], w, h)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                                    ,0x1ca,
                                    "void (anonymous namespace)::readFiles(const std::string &)");
                    }
                  }
                }
                IlmThread_3_4::TaskGroup::~TaskGroup((TaskGroup *)&header);
                lVar18 = 0x30;
                do {
                  std::
                  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                               *)(&ss + lVar18));
                  lVar18 = lVar18 + -0x30;
                  pTVar36 = local_398;
                } while (lVar18 != -0x30);
              }
              iVar11 = iVar11 + 1;
            }
          }
          std::_Vector_base<Imf_3_4::TiledInputPart,_std::allocator<Imf_3_4::TiledInputPart>_>::
          ~_Vector_base((_Vector_base<Imf_3_4::TiledInputPart,_std::allocator<Imf_3_4::TiledInputPart>_>
                         *)&file);
          lVar18 = 0x18;
          do {
            Imf_3_4::Array2D<Imath_3_2::half>::~Array2D
                      ((Array2D<Imath_3_2::half> *)((long)&uintData[0]._sizeX + lVar18));
            lVar18 = lVar18 + -0x18;
          } while (lVar18 != -0x18);
          lVar18 = 0x18;
          do {
            Imf_3_4::Array2D<float>::~Array2D
                      ((Array2D<float> *)((long)&floatData[0]._sizeX + lVar18));
            lVar18 = lVar18 + -0x18;
          } while (lVar18 != -0x18);
          lVar18 = 0x18;
          do {
            Imf_3_4::Array2D<unsigned_int>::~Array2D
                      ((Array2D<unsigned_int> *)((long)&halfData[0]._sizeX + lVar18));
            lVar18 = lVar18 + -0x18;
          } while (lVar18 != -0x18);
          Imf_3_4::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&parts);
          remove(fn._M_dataplus._M_p);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          std::ostream::flush();
          std::__cxx11::string::~string((string *)&local_238);
          lVar18 = 0x20;
          do {
            std::__cxx11::string::~string((string *)((long)&typeNames[0]._M_dataplus._M_p + lVar18))
            ;
            lVar18 = lVar18 + -0x20;
          } while (lVar18 != -0x20);
          std::__cxx11::string::~string((string *)&fn);
          uVar16 = uVar16 + 0x32;
        }
      }
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

void
testMultiTiledPartThreading (const std::string& tempDir)
{
    try
    {
        cout << "Testing the two threads reading/writing on two-tiled-part file"
             << endl;

        int numThreads = ThreadPool::globalThreadPool ().numThreads ();
        ThreadPool::globalThreadPool ().setNumThreads (2);

        for (int pt1 = 0; pt1 < 3; pt1++)
            for (int pt2 = 0; pt2 < 3; pt2++)
                for (int lm = 0; lm < 3; lm++)
                    for (int size = 1; size < min (width, height); size += 50)
                    {
                        pixelTypes[0] = pt1;
                        pixelTypes[1] = pt2;
                        levelMode     = lm;
                        tileSize      = size;
                        testWriteRead (tempDir);
                    }

        ThreadPool::globalThreadPool ().setNumThreads (numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}